

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

int __thiscall Image::saveFile(Image *this,string *filename)

{
  bool bVar1;
  int iVar2;
  string ext;
  
  suffix(&ext,filename);
  bVar1 = std::operator==(&ext,"");
  if (bVar1) {
    github111116::ConsoleLogger::warn<char[30]>
              (&console,(char (*) [30])"saveFile: unrecognized format");
LAB_0010ab06:
    iVar2 = -1;
  }
  else {
    bVar1 = std::operator==(&ext,"exr");
    if (bVar1) {
      SaveEXR(this->pixels,this->w,this->h,(filename->_M_dataplus)._M_p);
    }
    else {
      bVar1 = std::operator==(&ext,"bmp");
      if (!bVar1) {
        github111116::ConsoleLogger::warn<char[30],std::__cxx11::string>
                  (&console,(char (*) [30])"saveFile: unrecognized format",&ext);
        goto LAB_0010ab06;
      }
      writeBMP((filename->_M_dataplus)._M_p,this->pixels,this->w,this->h,2.2);
    }
    iVar2 = 0;
  }
  std::__cxx11::string::~string((string *)&ext);
  return iVar2;
}

Assistant:

int saveFile(const std::string& filename) const
	{
		std::string ext = suffix(filename);
		if (ext == "") {
			console.warn("saveFile: unrecognized format");
			return -1;
		}
		if (ext == "exr") {
			SaveEXR(pixels, w, h, filename.c_str());
			return 0;
		}
		if (ext == "bmp") {
			writeBMP(filename.c_str(), pixels, w, h);
			return 0;
		}
		console.warn("saveFile: unrecognized format", ext);
		return -1;
	}